

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getconf.cc
# Opt level: O0

result_t * getconfFunc(result_t *__return_storage_ptr__,Env *env,GetconfArgument *args)

{
  byte bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  runtime_error *this;
  ostream *poVar5;
  void *this_00;
  double dVar6;
  string local_328 [32];
  string local_308 [39];
  undefined1 local_2e1;
  string local_2e0 [8];
  string error_message;
  long local_2c0;
  ofstream conffd;
  double stddev;
  double trans_sq_avg;
  undefined1 local_a0 [8];
  DbaseCtrlBlk dcb;
  int maxnitem;
  int tsizesq;
  int tcustsum;
  int tsizesum;
  int oldtcnt;
  int oldcustid;
  int *buf;
  int local_48;
  int nitem;
  int tid;
  int custid;
  int i;
  float DBASE_AVG_CUST_SZ;
  float DBASE_AVG_TRANS_SZ;
  int DBASE_MAXTRANS;
  int DBASE_MINTRANS;
  int DBASE_NUM_CUST;
  int DBASE_MAXITEM;
  int DBASE_NUM_TRANS;
  GetconfArgument *args_local;
  Env *env_local;
  result_t *result;
  
  DBASE_NUM_CUST = 0;
  DBASE_MINTRANS = 0;
  DBASE_MAXTRANS = 0;
  DBASE_AVG_TRANS_SZ = 0.0;
  DBASE_AVG_CUST_SZ = 0.0;
  i = 0;
  custid = 0;
  nitem = 0;
  local_48 = 0;
  buf._4_4_ = 0;
  _oldtcnt = (int *)0x0;
  tsizesum = -1;
  tcustsum = 0;
  tsizesq = 0;
  maxnitem = 0;
  dcb._44_4_ = 0;
  dcb.readall = '\0';
  dcb._41_3_ = 0;
  _DBASE_MAXITEM = args;
  args_local = (GetconfArgument *)env;
  env_local = (Env *)__return_storage_ptr__;
  DbaseCtrlBlk::init((DbaseCtrlBlk *)local_a0,(EVP_PKEY_CTX *)args);
  DbaseCtrlBlk::get_first_blk((DbaseCtrlBlk *)local_a0);
  DbaseCtrlBlk::get_next_trans
            ((DbaseCtrlBlk *)local_a0,(int **)&oldtcnt,(int *)((long)&buf + 4),&local_48,&nitem);
  DBASE_AVG_TRANS_SZ = (float)nitem;
  while (iVar2 = DbaseCtrlBlk::eof((DbaseCtrlBlk *)local_a0), iVar2 == 0) {
    DBASE_AVG_CUST_SZ = (float)nitem;
    if (((_DBASE_MAXITEM->use_seq & 1U) != 0) && (tsizesum != nitem)) {
      maxnitem = (DBASE_NUM_CUST - tcustsum) + maxnitem;
      tcustsum = DBASE_NUM_CUST;
      DBASE_MAXTRANS = DBASE_MAXTRANS + 1;
      tsizesum = nitem;
    }
    DBASE_NUM_CUST = DBASE_NUM_CUST + 1;
    tsizesq = buf._4_4_ + tsizesq;
    if ((int)dcb._40_4_ < buf._4_4_) {
      dcb._40_4_ = buf._4_4_;
    }
    dcb._44_4_ = buf._4_4_ * buf._4_4_ + dcb._44_4_;
    for (tid = 0; tid < buf._4_4_; tid = tid + 1) {
      if (DBASE_MINTRANS < _oldtcnt[tid]) {
        DBASE_MINTRANS = _oldtcnt[tid];
      }
    }
    DbaseCtrlBlk::get_next_trans
              ((DbaseCtrlBlk *)local_a0,(int **)&oldtcnt,(int *)((long)&buf + 4),&local_48,&nitem);
  }
  DBASE_MINTRANS = DBASE_MINTRANS + 1;
  if ((_DBASE_MAXITEM->use_seq & 1U) != 0) {
    custid = (int)(((float)((DBASE_NUM_CUST - tcustsum) + maxnitem) * 1.0) / (float)DBASE_MAXTRANS);
  }
  i = (int)((float)tsizesq / (float)DBASE_NUM_CUST);
  dVar6 = sqrt((double)(int)dcb._44_4_ / (double)DBASE_NUM_CUST - (double)((float)i * (float)i));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_bin,_S_out);
  std::ofstream::ofstream(&local_2c0,pcVar4,_Var3);
  bVar1 = std::ios::operator!((void *)((long)&local_2c0 + *(long *)(local_2c0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    if ((_DBASE_MAXITEM->use_seq & 1U) == 0) {
      std::ostream::write((char *)&local_2c0,(long)&DBASE_NUM_CUST);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_MINTRANS);
      std::ostream::write((char *)&local_2c0,(long)&i);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_AVG_TRANS_SZ);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_AVG_CUST_SZ);
    }
    else {
      std::ostream::write((char *)&local_2c0,(long)&DBASE_MAXTRANS);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_MINTRANS);
      std::ostream::write((char *)&local_2c0,(long)&custid);
      std::ostream::write((char *)&local_2c0,(long)&i);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_NUM_CUST);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_AVG_TRANS_SZ);
      std::ostream::write((char *)&local_2c0,(long)&DBASE_AVG_CUST_SZ);
    }
    std::ofstream::close();
    poVar5 = std::operator<<((ostream *)&args_local[10].confn,"CONF ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,DBASE_MAXTRANS);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,DBASE_MINTRANS);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)custid);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)i);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,DBASE_NUM_CUST);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)DBASE_AVG_TRANS_SZ);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)DBASE_AVG_CUST_SZ);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar6);
    poVar5 = std::operator<<(poVar5," ");
    this_00 = (void *)std::ostream::operator<<(poVar5,dcb._40_4_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_2e1 = 0;
    result_t::result_t(__return_storage_ptr__);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->logger,local_308);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->summary,local_328);
    std::__cxx11::string::~string(local_328);
    local_2e1 = 1;
    std::ofstream::~ofstream(&local_2c0);
    DbaseCtrlBlk::~DbaseCtrlBlk((DbaseCtrlBlk *)local_a0);
    return __return_storage_ptr__;
  }
  std::operator+((char *)local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "can\'t open file: ");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_2e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

result_t getconfFunc(Env& env, const GetconfArgument& args) {
    int DBASE_NUM_TRANS = 0;
    int DBASE_MAXITEM = 0;
    int DBASE_NUM_CUST = 0;
    int DBASE_MINTRANS = 0;
    int DBASE_MAXTRANS = 0;
    float DBASE_AVG_TRANS_SZ = 0;
    float DBASE_AVG_CUST_SZ = 0;

    int i;

    int custid = 0, tid = 0, nitem = 0;
    int *buf = nullptr;
    int oldcustid = -1;
    int oldtcnt = 0;
    int tsizesum = 0;
    int tcustsum = 0;
    int tsizesq = 0;
    int maxnitem = 0;

    DbaseCtrlBlk dcb;
    dcb.init(args.input);

    dcb.get_first_blk();
    dcb.get_next_trans(buf, nitem, tid, custid);
    DBASE_MINTRANS = custid;
    while (!dcb.eof()) {
        //printf ("%d %d %d\n", custid, tid, nitem);
        DBASE_MAXTRANS = custid;
        if (args.use_seq) {
            if (oldcustid != custid) {
                tcustsum += DBASE_NUM_TRANS - oldtcnt;
                oldtcnt = DBASE_NUM_TRANS;
                DBASE_NUM_CUST++;
                oldcustid = custid;
            }
        }
        DBASE_NUM_TRANS++;
        tsizesum += nitem;
        if (nitem > maxnitem) maxnitem = nitem;

        tsizesq += (nitem * nitem);
        for (i = 0; i < nitem; i++)
            if (buf[i] > DBASE_MAXITEM) DBASE_MAXITEM = buf[i];
        dcb.get_next_trans(buf, nitem, tid, custid);
    }
    tcustsum += DBASE_NUM_TRANS - oldtcnt;
    DBASE_MAXITEM++;

    if (args.use_seq) {
        DBASE_AVG_CUST_SZ = (1.0 * tcustsum) / DBASE_NUM_CUST;
    }
    DBASE_AVG_TRANS_SZ = (1.0 * tsizesum) / DBASE_NUM_TRANS;
    double trans_sq_avg = (1.0 * tsizesq) / DBASE_NUM_TRANS;
    double stddev = sqrt(trans_sq_avg - (DBASE_AVG_TRANS_SZ * DBASE_AVG_TRANS_SZ));


    //write config info to new file
    ofstream conffd(args.confn.c_str(), ios::binary | ios::out);

    if (!conffd) {
        string error_message = "can't open file: " + args.confn;
        throw runtime_error(error_message);
    }

    if (args.use_seq) {
        conffd.write((char *) &DBASE_NUM_CUST, INT_SIZE);
        conffd.write((char *) &DBASE_MAXITEM, INT_SIZE);
        conffd.write((char *) &DBASE_AVG_CUST_SZ, sizeof(float));
        conffd.write((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        conffd.write((char *) &DBASE_NUM_TRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MINTRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXTRANS, INT_SIZE);
    } else {
        conffd.write((char *) &DBASE_NUM_TRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXITEM, INT_SIZE);
        conffd.write((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        conffd.write((char *) &DBASE_MINTRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXTRANS, INT_SIZE);
    }

    conffd.close();
    env.summary << "CONF " << DBASE_NUM_CUST << " " << DBASE_MAXITEM << " " << DBASE_AVG_CUST_SZ
            << " " << DBASE_AVG_TRANS_SZ << " " << DBASE_NUM_TRANS << " " << DBASE_MINTRANS
            << " " << DBASE_MAXTRANS << " " << stddev << " " << maxnitem << endl;

    result_t result;
    result.logger = env.logger.str();
    result.summary = env.summary.str();
    return result;
}